

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::common_sendReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc,int wait)

{
  int iVar1;
  vm_httpreq_ext *pvVar2;
  vm_val_t *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  int *piVar6;
  char *pcVar7;
  HTTPReplySender *this_00;
  ssize_t sVar8;
  uint *in_RCX;
  vm_httpreq_cookie *cookies;
  vm_val_t *in_RDX;
  void *__buf;
  undefined4 in_ESI;
  CVmObjHTTPRequest *in_RDI;
  int in_R8D;
  http_reply_err err;
  vm_val_t *headers;
  char *status;
  size_t status_len;
  size_t rem;
  utf8_ptr p;
  char *bufp;
  int32_t len;
  int32_t ofs;
  char buf [512];
  size_t cont_type_len;
  char *cont_type;
  err_frame_t err_cur__;
  HTTPReplySender *sender;
  bodyArg *body;
  TadsHttpRequest *req;
  uint argc;
  bodyArg *in_stack_fffffffffffffbc8;
  int sock_err;
  HTTPReplySender *in_stack_fffffffffffffbd0;
  vm_val_t *in_stack_fffffffffffffbd8;
  vm_val_t *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  vm_obj_id_t reqid;
  void *pvVar9;
  HTTPReplySender *in_stack_fffffffffffffbf0;
  undefined8 uVar10;
  undefined4 in_stack_fffffffffffffc08;
  size_t in_stack_fffffffffffffc10;
  TadsHttpRequest *cont_type_len_00;
  void *in_stack_fffffffffffffc18;
  void *in_stack_fffffffffffffc20;
  uint local_3ac;
  undefined1 local_3a0 [16];
  vm_val_t *local_390;
  vm_httpreq_cookie *local_388;
  int local_380;
  ulong local_378;
  utf8_ptr local_370;
  int *local_368;
  int local_360;
  undefined4 local_35c;
  char *local_150;
  HTTPReplySender *local_148;
  uint local_140 [2];
  undefined8 local_138;
  void *local_130;
  __jmp_buf_tag _Stack_128;
  HTTPReplySender *local_60;
  vm_val_t *local_58;
  TadsHttpRequest *local_50;
  uint local_38;
  int local_34;
  vm_val_t *local_28;
  undefined4 local_1c;
  
  if (in_RCX == (uint *)0x0) {
    local_3ac = 0;
  }
  else {
    local_3ac = *in_RCX;
  }
  local_38 = local_3ac;
  local_34 = in_R8D;
  local_28 = in_RDX;
  local_1c = in_ESI;
  if ((common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc)
     , iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&common_sendReply::desc,1,3);
    __cxa_guard_release(&common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffbd8,(uint *)in_stack_fffffffffffffbd0,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffbc8);
  if (iVar1 != 0) {
    return 1;
  }
  pvVar2 = get_ext(in_RDI);
  local_50 = pvVar2->req;
  if ((local_50->super_TadsEventMessage).super_TadsMessage.completed != 0) {
    throw_net_err((char *)in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20))
    ;
  }
  pvVar3 = (vm_val_t *)operator_new(0x58);
  bodyArg::bodyArg((bodyArg *)in_stack_fffffffffffffbf0,
                   (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  local_60 = (HTTPReplySender *)0x0;
  local_58 = pvVar3;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_138 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_140;
  local_140[0] = _setjmp(&_Stack_128);
  if (local_140[0] != 0) goto LAB_002584f0;
  local_148 = (HTTPReplySender *)0x0;
  local_150 = (char *)0x0;
  if (*(int *)&local_58->field_0x4 != 0) {
    err_throw(0);
  }
  if (local_58[4].val.obj == 0) {
    if (local_58->typ == 0) {
      if (1 < local_38) {
        pvVar3 = CVmStack::get(1);
        if (pvVar3->typ != VM_NIL) {
          CVmStack::get(1);
          local_148 = (HTTPReplySender *)
                      vm_val_t::get_as_string((vm_val_t *)in_stack_fffffffffffffbc8);
          if (local_148 == (HTTPReplySender *)0x0) {
            err_throw(0);
          }
          local_150 = (char *)vmb_get_len((char *)0x257e5a);
          local_148 = (HTTPReplySender *)((long)local_148 + 2);
          goto LAB_00258307;
        }
      }
      local_35c = 0;
      local_360 = 0x200;
      local_368 = (int *)bodyArg::extract((bodyArg *)in_stack_fffffffffffffbf0,
                                          in_stack_fffffffffffffbe8,
                                          (int32_t *)in_stack_fffffffffffffbe0,
                                          (int32_t *)in_stack_fffffffffffffbd8);
      iVar1 = bodyArg::is_text(in_stack_fffffffffffffbc8);
      if (iVar1 == 0) {
        if ((((local_360 < 0xb) || ((char)*local_368 != -1)) ||
            (*(char *)((long)local_368 + 1) != -0x28)) ||
           (*(int *)((long)local_368 + 6) != 0x4649464a)) {
          if ((local_360 < 7) ||
             ((iVar1 = memcmp(local_368,"GIF87a",6), iVar1 != 0 &&
              (iVar1 = memcmp(local_368,"GIF89a",6), iVar1 != 0)))) {
            if ((local_360 < 7) || (iVar1 = memcmp(local_368,anon_var_dwarf_5957b,6), iVar1 != 0)) {
              if ((local_360 < 4) || (iVar1 = memcmp(local_368,"ID3",3), iVar1 != 0)) {
                if ((local_360 < 0xf) || (iVar1 = memcmp(local_368,"OggS",0xe), iVar1 != 0)) {
                  if ((local_360 < 5) || (*local_368 != 0x4468544d)) {
                    if ((local_360 < 9) ||
                       ((iVar1 = memcmp(local_368,"FWS",3), iVar1 != 0 &&
                        (iVar1 = memcmp(local_368,"CWS",3), iVar1 != 0)))) {
                      local_148 = (HTTPReplySender *)0x3a9194;
                    }
                    else {
                      local_148 = (HTTPReplySender *)0x3a93c8;
                    }
                  }
                  else {
                    local_148 = (HTTPReplySender *)0x3a93b5;
                  }
                }
                else {
                  local_148 = (HTTPReplySender *)0x3a93a0;
                }
              }
              else {
                local_148 = (HTTPReplySender *)0x3a9395;
              }
            }
            else {
              local_148 = (HTTPReplySender *)0x3a9387;
            }
          }
          else {
            local_148 = (HTTPReplySender *)0x3a9374;
          }
        }
        else {
          local_148 = (HTTPReplySender *)0x3a935b;
        }
      }
      else {
        utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
        local_378 = (ulong)local_360;
LAB_00257ef9:
        if (local_378 != 0) {
          if ((local_378 < 4) ||
             (piVar6 = (int *)utf8_ptr::getptr(&local_370), *piVar6 != 0x2d2d213c)) {
            utf8_ptr::getch((utf8_ptr *)0x257feb);
            iVar1 = t3_is_whitespace((wchar_t)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            if (iVar1 == 0) goto LAB_00258013;
            utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffbe0,(size_t *)in_stack_fffffffffffffbd8)
            ;
          }
          else {
            while (local_378 != 0) {
              if (2 < local_378) {
                pcVar7 = utf8_ptr::getptr(&local_370);
                iVar1 = memcmp(pcVar7,"-->",3);
                if (iVar1 == 0) {
                  utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffbe0,
                                (size_t *)in_stack_fffffffffffffbd8);
                  utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffbe0,
                                (size_t *)in_stack_fffffffffffffbd8);
                  utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffbe0,
                                (size_t *)in_stack_fffffffffffffbd8);
                  break;
                }
              }
              utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffbe0,
                            (size_t *)in_stack_fffffffffffffbd8);
            }
          }
          goto LAB_00257ef9;
        }
LAB_00258013:
        if (local_378 < 6) {
LAB_00258044:
          utf8_ptr::getptr(&local_370);
          iVar1 = eq_skip_sp(in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                             (char *)in_stack_fffffffffffffbd8);
          if (iVar1 == 0) {
            if (5 < local_378) {
              utf8_ptr::getptr(&local_370);
              iVar1 = memicmp(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                              in_stack_fffffffffffffc10);
              if (iVar1 == 0) {
                local_148 = (HTTPReplySender *)0x3a9342;
                goto LAB_002582ee;
              }
            }
            local_148 = (HTTPReplySender *)0x3a934b;
            goto LAB_002582ee;
          }
        }
        else {
          utf8_ptr::getptr(&local_370);
          iVar1 = memicmp(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          in_stack_fffffffffffffc10);
          if (iVar1 != 0) goto LAB_00258044;
        }
        local_148 = (HTTPReplySender *)0x3a9313;
      }
LAB_002582ee:
      local_150 = (char *)strlen((char *)local_148);
    }
    else {
      local_148 = (HTTPReplySender *)0x0;
      local_150 = (char *)0x0;
    }
  }
  else {
    local_148 = (HTTPReplySender *)0x3a9313;
    local_150 = (char *)0x9;
  }
LAB_00258307:
  local_388 = (vm_httpreq_cookie *)
              get_status_arg((int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                             (int)in_stack_fffffffffffffbe8,
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                             (size_t *)in_stack_fffffffffffffbd8);
  reqid = (vm_obj_id_t)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_390 = (vm_val_t *)0x0;
  if ((3 < local_38) && (pvVar3 = CVmStack::get(3), pvVar3->typ != VM_NIL)) {
    local_390 = CVmStack::get(3);
    iVar1 = vm_val_t::is_listlike(in_stack_fffffffffffffbe0);
    if (iVar1 == 0) {
      err_throw(0);
    }
  }
  this_00 = (HTTPReplySender *)operator_new(0x78);
  HTTPReplySender::HTTPReplySender(in_stack_fffffffffffffbd0);
  pvVar3 = local_58;
  in_stack_fffffffffffffbd0 = local_148;
  pcVar7 = local_150;
  cont_type_len_00 = local_50;
  cookies = local_388;
  local_60 = this_00;
  iVar1 = local_380;
  pvVar2 = get_ext(in_RDI);
  HTTPReplySender::set_params
            (in_stack_fffffffffffffbf0,reqid,(TadsHttpRequest *)pvVar2->cookies,pcVar7,
             (size_t)in_stack_fffffffffffffbd0,pvVar3,(bodyArg *)this_00,
             (char *)CONCAT44(local_1c,in_stack_fffffffffffffc08),(size_t)cont_type_len_00,cookies);
  sock_err = (int)((ulong)pvVar3 >> 0x20);
  local_58 = (vm_val_t *)0x0;
  if (local_34 == 0) {
    HTTPReplySender::start_thread(this_00);
  }
  else {
    sVar8 = HTTPReplySender::send(local_60,(int)local_3a0,__buf,(size_t)cookies,iVar1);
    if ((int)sVar8 == 0) {
      throw_net_err((char *)in_stack_fffffffffffffbd0,sock_err);
    }
  }
LAB_002584f0:
  pvVar3 = local_58;
  if ((local_140[0] & 0x8000) == 0) {
    local_140[0] = local_140[0] | 0x8000;
    if ((local_58 != (vm_val_t *)0x0) && (local_58 != (vm_val_t *)0x0)) {
      bodyArg::~bodyArg((bodyArg *)in_stack_fffffffffffffbd0);
      operator_delete(pvVar3,0x58);
    }
    if (local_60 != (HTTPReplySender *)0x0) {
      CVmRefCntObj::release_ref(&in_stack_fffffffffffffbd0->super_CVmRefCntObj);
    }
  }
  uVar10 = local_138;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar10;
  if ((local_140[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar9 = local_130;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar9;
    err_rethrow();
  }
  if ((local_140[0] & 2) != 0) {
    free(local_130);
  }
  CVmStack::discard(local_38);
  vm_val_t::set_nil(local_28);
  return 1;
}

Assistant:

int CVmObjHTTPRequest::common_sendReply(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc, int wait)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request */
    TadsHttpRequest *req = get_ext()->req;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* get the 'body' argument (leave it on the stack for gc protection) */
    bodyArg *body = new bodyArg(vmg_ 0);

    /* no reply sender yet */
    HTTPReplySender *sender = 0;

    err_try
    {
        /* get the content type, if present */
        const char *cont_type = 0;
        size_t cont_type_len = 0;
        if (body->init_err != 0)
        {
            err_throw(body->init_err);
        }
        else if (body->status_code != 0)
        {
            /* we're using a generated HTML reply, so it's always text/html */
            cont_type = "text/html";
            cont_type_len = 9;
        }
        else if (body->none)
        {
            /* no body -> no content type */
            cont_type = 0;
            cont_type_len = 0;
        }
        else if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        {
            /* retrieve the content type - this must be a string */
            cont_type = G_stk->get(1)->get_as_string(vmg0_);
            if (cont_type == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* get the length and buffer pointer */
            cont_type_len = vmb_get_len(cont_type);
            cont_type += VMB_LEN;
        }
        else
        {
            /* 
             *   There's no content type argument, so we need to infer the
             *   type from the 'body' argument.  First, extract the initial
             *   section of the content to check for common signatures.  
             */
            char buf[512];
            int32_t ofs = 0, len = sizeof(buf);
            const char *bufp = body->extract(buf, ofs, len);

            /* check to see if the body is text or binary */
            if (body->is_text(vmg0_))
            {
                /* 
                 *   it's text data, so check for tell-tale signs of HTML and
                 *   XML, after skipping leading whitespace and HTML-style
                 *   comments 
                 */
                utf8_ptr p((char *)bufp);
                size_t rem = (size_t)len;
                while (rem != 0)
                {
                    /* if we're at a comment starter, skip the comment */
                    if (rem >= 4 && memcmp(p.getptr(), "<!--", 4) == 0)
                    {
                        /* skip to the closing sequence */
                        for ( ; rem != 0 ; p.inc(&rem))
                        {
                            if (rem >= 3 && memcmp(p.getptr(), "-->", 3) == 0)
                            {
                                /* skip it and stop looking */
                                p.inc(&rem);
                                p.inc(&rem);
                                p.inc(&rem);
                                break;
                            }
                        }

                        /* continue scanning */
                        continue;
                    }

                    /* if we're at any whitespace character, just skip it */
                    if (t3_is_whitespace(p.getch()))
                    {
                        p.inc(&rem);
                        continue;
                    }

                    /* otherwise stop scanning */
                    break;
                }

                /* check for <HTML or <?XML prefixes */
                if ((rem > 5 && memicmp(p.getptr(), "<html", 5) == 0)
                    || eq_skip_sp(p.getptr(), rem, "<!doctype html "))
                {
                    /* it looks like HTML */
                    cont_type = "text/html";
                }
                else if (rem > 5 && memicmp(p.getptr(), "<?xml", 5) == 0)
                {
                    /* it looks like XML */
                    cont_type = "text/xml";
                }
                else
                {
                    /* it doesn't look like HTML or XML, so use plain text */
                    cont_type = "text/plain";
                }
            }
            else
            {
                /* 
                 *   Treat it as binary data.  Check the first few bytes to
                 *   see if the file signature matches a known media type.  
                 */
                if (len > 10
                    && (unsigned char)bufp[0] == 0xff
                    && (unsigned char)bufp[1] == 0xd8
                    && memcmp(bufp+6, "JFIF", 4) == 0)
                {
                    /* it's a JPEG image */
                    cont_type = "image/jpeg";
                }
                else if (len > 6
                         && (memcmp(bufp, "GIF87a", 6) == 0
                             || memcmp(bufp, "GIF89a", 6) == 0))
                {
                    /* it's a GIF image */
                    cont_type = "image/gif";
                }
                else if (len > 6 && memcmp(bufp, "\211PNG\r\n\032\n", 6) == 0)
                {
                    /* it's a PNG image */
                    cont_type = "image/png";
                }
                else if (len > 3 && memcmp(bufp, "ID3", 3) == 0)
                {
                    /* MP3 file */
                    cont_type = "audio/mpeg";
                }
                else if (len > 14 && memcmp(
                    bufp, "OggS\000\002\000\000\000\000\000\000\000\000", 14)
                         == 0)
                {
                    /* Ogg Vorbis audio */
                    cont_type = "application/ogg";
                }
                else if (len > 4 && memcmp(bufp, "MThD", 4) == 0)
                {
                    /* MIDI */
                    cont_type = "audio/midi";
                }
                else if (len > 8
                         && (memcmp(bufp, "FWS", 3) == 0
                             || memcmp(bufp, "CWS", 3) == 0))
                {
                    /* shockwave flash */
                    cont_type = "application/x-shockwave-flash";
                }
                else
                {
                    /* we don't recognize it; use generic binary */
                    cont_type = "application/octet-stream";
                }
            }

            /* get the length of the content type string we selected */
            cont_type_len = strlen(cont_type);
        }

        /* get the result code, if present */
        size_t status_len;
        const char *status = get_status_arg(vmg_ body->status_code,
                                            2, argc, status_len);

        /* get the headers argument */
        vm_val_t *headers = 0;
        if (argc >= 4 && G_stk->get(3)->typ != VM_NIL)
        {
            /* get the headers value */
            headers = G_stk->get(3);

            /* make sure it's a list */
            if (!headers->is_listlike(vmg0_))
                err_throw(VMERR_LIST_VAL_REQD);
        }

        /* set up a reply sender object */
        sender = new HTTPReplySender();
        sender->set_params(
            vmg_ self, req, status, status_len, headers, body,
            cont_type, cont_type_len, get_ext()->cookies);

        /* the sender now owns our 'body' object */
        body = 0;

        /* send the reply, either directly or in a new thread */
        if (wait)
        {
            /* waiting for completion - send in the current thread */
            http_reply_err err;
            if (!sender->send(&err))
                throw_net_err(vmg_ err.msg, err.sock_err);
        }
        else
        {
            /* sending asynchronously - send in a new thread */
            sender->start_thread(vmg0_);
        }
    }